

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QLoggingRule>::emplace<QLoggingRule>
          (QMovableArrayOps<QLoggingRule> *this,qsizetype i,QLoggingRule *args)

{
  QLoggingRule **ppQVar1;
  qsizetype *pqVar2;
  QLoggingRule *pQVar3;
  undefined4 uVar4;
  long lVar5;
  Data *pDVar6;
  long lVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  undefined4 uVar11;
  PatternFlags PVar12;
  QLoggingRule *pQVar13;
  bool bVar14;
  long in_FS_OFFSET;
  bool bVar15;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0024da00:
    pDVar8 = (args->category).d.d;
    pcVar9 = (args->category).d.ptr;
    (args->category).d.d = (Data *)0x0;
    (args->category).d.ptr = (char16_t *)0x0;
    qVar10 = (args->category).d.size;
    (args->category).d.size = 0;
    bVar14 = args->enabled;
    uVar4 = args->messageType;
    uVar11 = args->flags;
    bVar15 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size
             != 0;
    QArrayDataPointer<QLoggingRule>::detachAndGrow
              ((QArrayDataPointer<QLoggingRule> *)this,(uint)(i == 0 && bVar15),1,
               (QLoggingRule **)0x0,(QArrayDataPointer<QLoggingRule> *)0x0);
    pQVar13 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr
    ;
    if (i != 0 || !bVar15) {
      pQVar3 = pQVar13 + i;
      memmove(pQVar3 + 1,pQVar13 + i,
              ((this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
               size - i) * 0x28);
      (pQVar3->category).d.d = pDVar8;
      (pQVar3->category).d.ptr = pcVar9;
      (pQVar3->category).d.size = qVar10;
      pQVar3->messageType = uVar4;
      pQVar3->flags = (PatternFlags)uVar11;
      pQVar3->enabled = bVar14;
      goto LAB_0024dac3;
    }
    pQVar13[-1].category.d.d = pDVar8;
    pQVar13[-1].category.d.ptr = pcVar9;
    pQVar13[-1].category.d.size = qVar10;
    pQVar13[-1].messageType = uVar4;
    pQVar13[-1].flags = (PatternFlags)uVar11;
  }
  else {
    lVar7 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size;
    if ((lVar7 == i && pDVar6 != (Data *)0x0) &&
       ((pDVar6->super_QArrayData).alloc - lVar7 !=
        ((long)((long)(this->super_QGenericArrayOps<QLoggingRule>).
                      super_QArrayDataPointer<QLoggingRule>.ptr -
               ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pQVar13 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
                ptr;
      pDVar8 = (args->category).d.d;
      (args->category).d.d = (Data *)0x0;
      pQVar13[lVar7].category.d.d = pDVar8;
      pcVar9 = (args->category).d.ptr;
      (args->category).d.ptr = (char16_t *)0x0;
      pQVar13[lVar7].category.d.ptr = pcVar9;
      qVar10 = (args->category).d.size;
      (args->category).d.size = 0;
      pQVar13[lVar7].category.d.size = qVar10;
      PVar12.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
      super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
           (args->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
      pQVar13[lVar7].messageType = args->messageType;
      pQVar13[lVar7].flags =
           (PatternFlags)
           PVar12.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
           super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
      pQVar13[lVar7].enabled = args->enabled;
      goto LAB_0024dac3;
    }
    if (((i != 0) || (pDVar6 == (Data *)0x0)) ||
       ((QLoggingRule *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
        == (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr))
    goto LAB_0024da00;
    pQVar13 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr
    ;
    pDVar8 = (args->category).d.d;
    (args->category).d.d = (Data *)0x0;
    pQVar13[-1].category.d.d = pDVar8;
    pcVar9 = (args->category).d.ptr;
    (args->category).d.ptr = (char16_t *)0x0;
    pQVar13[-1].category.d.ptr = pcVar9;
    qVar10 = (args->category).d.size;
    (args->category).d.size = 0;
    pQVar13[-1].category.d.size = qVar10;
    PVar12.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
    super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
         (args->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
    pQVar13[-1].messageType = args->messageType;
    pQVar13[-1].flags =
         (PatternFlags)
         PVar12.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
         super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
    bVar14 = args->enabled;
  }
  pQVar13[-1].enabled = bVar14;
  ppQVar1 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0024dac3:
  pqVar2 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }